

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  string *value;
  Edition value_00;
  pointer __s1;
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  SourceCodeInfo *pSVar5;
  LogMessage *this_00;
  ulong uVar6;
  Arena *pAVar7;
  byte bVar8;
  LocationRecorder *unaff_RBP;
  size_type __rlen;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LogMessage LStack_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  LocationRecorder local_90;
  SourceCodeInfo local_78;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_78,(Arena *)0x0);
  this->source_code_info_ = &local_78;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_90,this);
  LocationRecorder::RecordLegacyLocation(&local_90,&file->super_Message,OTHER);
  value = &this->syntax_identifier_;
  if (this->require_syntax_identifier_ == false) {
    __s1 = (this->input_->current_).text._M_dataplus._M_p;
    sVar1 = (this->input_->current_).text._M_string_length;
    if (sVar1 == 7) {
      iVar4 = bcmp(__s1,"edition",7);
      if (iVar4 != 0) goto LAB_001fad4e;
      goto LAB_001fac7d;
    }
    if ((sVar1 == 6) && (iVar4 = bcmp(__s1,"syntax",6), iVar4 == 0)) goto LAB_001fac7d;
LAB_001fad4e:
    if (this->stop_after_syntax_identifier_ == false) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&LStack_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser.cc"
                 ,0x266);
      str._M_str = "No edition or syntax specified for the proto file: ";
      str._M_len = 0x33;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&LStack_a8,str);
      this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (&LStack_a8,
                           (string *)
                           ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc));
      str_00._M_str = ". Please use \'edition = \"YYYY\";\' ";
      str_00._M_len = 0x21;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (this_00,str_00);
      str_01._M_str = " to specify a valid edition ";
      str_01._M_len = 0x1c;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (this_00,str_01);
      str_02._M_str = "version. (Defaulted to \"syntax = \"proto2\";\".)";
      str_02._M_len = 0x2d;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (this_00,str_02);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_a8);
      std::__cxx11::string::operator=((string *)value,"proto2");
    }
LAB_001fad58:
    if (this->stop_after_syntax_identifier_ == false) {
      bVar2 = true;
      if ((this->input_->current_).type != TYPE_END) {
        local_98 = &this->upcoming_detached_comments_;
        unaff_RBP = &local_90;
        do {
          bVar3 = ParseTopLevelStatement(this,file,unaff_RBP);
          if (!bVar3) {
            SkipStatement(this);
            if (((this->input_->current_).text._M_string_length == 1) &&
               (iVar4 = bcmp((this->input_->current_).text._M_dataplus._M_p,"}",1), iVar4 == 0)) {
              RecordError(this,(ErrorMaker)ZEXT816(0x3e9cba));
              io::Tokenizer::NextWithComments
                        (this->input_,(string *)0x0,local_98,&this->upcoming_doc_comments_);
            }
          }
        } while ((this->input_->current_).type != TYPE_END);
      }
      bVar8 = (byte)unaff_RBP;
      goto LAB_001fadf8;
    }
    bVar8 = this->had_errors_ ^ 1;
  }
  else {
LAB_001fac7d:
    bVar2 = ParseSyntaxIdentifier(this,file,&local_90);
    if (bVar2) {
      if (file != (FileDescriptorProto *)0x0) {
        *(byte *)&file->field_0 = *(byte *)&file->field_0 | 4;
        pAVar7 = (Arena *)(file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>(&(file->field_0)._impl_.syntax_,value,pAVar7);
        iVar4 = std::__cxx11::string::compare((char *)value);
        if (iVar4 == 0) {
          value_00 = this->edition_;
          unaff_RBP = (LocationRecorder *)(ulong)value_00;
          bVar2 = internal::ValidateEnum(value_00,(uint32_t *)Edition_internal_data_);
          if (!bVar2) {
            __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                          ,0x34a2,
                          "void google::protobuf::FileDescriptorProto::_internal_set_edition(::google::protobuf::Edition)"
                         );
          }
          (file->field_0)._impl_.edition_ = value_00;
          *(byte *)&file->field_0 = *(byte *)&file->field_0 | 0x20;
        }
      }
      goto LAB_001fad58;
    }
    bVar8 = 0;
  }
  bVar2 = false;
LAB_001fadf8:
  LocationRecorder::~LocationRecorder(&local_90);
  if (bVar2) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    if (file == (FileDescriptorProto *)0x0) {
      __assert_fail("file != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser.cc"
                    ,0x281,
                    "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                   );
    }
    *(byte *)&file->field_0 = *(byte *)&file->field_0 | 0x10;
    if ((file->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0) {
      pAVar7 = (Arena *)(file->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      pSVar5 = (SourceCodeInfo *)Arena::DefaultConstruct<google::protobuf::SourceCodeInfo>(pAVar7);
      (file->field_0)._impl_.source_code_info_ = pSVar5;
    }
    pSVar5 = (file->field_0)._impl_.source_code_info_;
    if (pSVar5 != &local_78) {
      if ((local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ =
             *(ulong *)(local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                       0xfffffffffffffffe);
      }
      uVar6 = (pSVar5->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar6 & 1) != 0) {
        uVar6 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
      }
      if (local_78.super_Message.super_MessageLite._internal_metadata_.ptr_ == uVar6) {
        SourceCodeInfo::InternalSwap(&local_78,pSVar5);
      }
      else {
        internal::GenericSwap(&local_78.super_Message,&pSVar5->super_Message);
      }
    }
    bVar8 = this->had_errors_ ^ 1;
  }
  SourceCodeInfo::~SourceCodeInfo(&local_78);
  return (bool)(bVar8 & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax") ||
        LookingAt("edition")) {
      if (!ParseSyntaxIdentifier(file, root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != nullptr) {
        file->set_syntax(syntax_identifier_);
        if (syntax_identifier_ == "editions") {
          file->set_edition(edition_);
        }
      }
    } else if (!stop_after_syntax_identifier_) {
      ABSL_LOG(WARNING) << "No edition or syntax specified for the proto file: "
                        << file->name() << ". Please use 'edition = \"YYYY\";' "
                        << " to specify a valid edition "
                        << "version. (Defaulted to \"syntax = \"proto2\";\".)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          RecordError("Unmatched \"}\".");
          input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = nullptr;
  source_code_info_ = nullptr;
  assert(file != nullptr);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}